

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O1

void __thiscall
checkqueue_tests::test_CheckQueue_Recovers_From_Failure::test_method
          (test_CheckQueue_Recovers_From_Failure *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  CCheckQueue<FakeCheckCheckCompletion> *this_00;
  long lVar4;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  __single_object fail_queue;
  CCheckQueueControl<FailingCheck> control;
  check_type in_stack_ffffffffffffff20;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  lazy_ostream local_b8;
  undefined1 *local_a8;
  char **local_a0;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  _Head_base<0UL,_CCheckQueue<FailingCheck>_*,_false> local_58;
  CCheckQueueControl<FailingCheck> local_50;
  char local_3a [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CCheckQueue<FakeCheckCheckCompletion> *)operator_new(0x100);
  CCheckQueue<FailingCheck>::CCheckQueue((CCheckQueue<FailingCheck> *)this_00,0x80,3);
  iVar3 = 0;
  local_58._M_head_impl = this_00;
  do {
    local_3a[0] = '\x01';
    local_3a[1] = '\0';
    lVar4 = 0;
    do {
      cVar1 = local_3a[lVar4];
      CCheckQueueControl<FailingCheck>::CCheckQueueControl(&local_50,local_58._M_head_impl);
      local_b8._vptr_lazy_ostream = (_func_int **)0x0;
      local_b8._8_8_ = 0;
      local_a8 = (undefined1 *)0x0;
      local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::resize
                ((vector<FailingCheck,_std::allocator<FailingCheck>_> *)&local_b8,100,
                 (value_type *)&local_90);
      *(char *)((long)local_b8._vptr_lazy_ostream + 99) = cVar1;
      if (local_50.pqueue != (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
        CCheckQueue<FailingCheck>::Add
                  ((CCheckQueue<FailingCheck> *)local_50.pqueue,
                   (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                   &local_b8);
      }
      if (local_b8._vptr_lazy_ostream != (_func_int **)0x0) {
        operator_delete(local_b8._vptr_lazy_ostream,
                        (long)local_a8 - (long)local_b8._vptr_lazy_ostream);
      }
      if (local_50.pqueue == (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
        bVar2 = true;
      }
      else {
        bVar2 = CCheckQueue<FailingCheck>::Loop((CCheckQueue<FailingCheck> *)local_50.pqueue,true);
        local_50.fDone = true;
      }
      local_68 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_60 = "";
      local_78 = &boost::unit_test::basic_cstring<char_const>::null;
      local_70 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x103;
      file.m_begin = (iterator)&local_68;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
      local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)((bool)cVar1 != bVar2);
      local_90.m_message.px = (element_type *)0x0;
      local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_c8 = "r != end_fails";
      local_c0 = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      local_a0 = &local_c8;
      local_d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_d0 = "";
      in_R8 = (iterator)0x2;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_90,&local_b8,2,0,WARN,CONCAT44(iVar3,in_stack_ffffffffffffff20),
                 (size_t)&local_d8,0x103);
      boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
      CCheckQueueControl<FailingCheck>::~CCheckQueueControl(&local_50);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  std::unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>::
  ~unique_ptr((unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>
               *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Recovers_From_Failure)
{
    auto fail_queue = std::make_unique<Failing_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    for (auto times = 0; times < 10; ++times) {
        for (const bool end_fails : {true, false}) {
            CCheckQueueControl<FailingCheck> control(fail_queue.get());
            {
                std::vector<FailingCheck> vChecks;
                vChecks.resize(100, false);
                vChecks[99] = end_fails;
                control.Add(std::move(vChecks));
            }
            bool r =control.Wait();
            BOOST_REQUIRE(r != end_fails);
        }
    }
}